

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void open_local_endpoint(connection *conn,int skip_user)

{
  char *__s1;
  int iVar1;
  int iVar2;
  bool local_20b9;
  char *enp;
  undefined1 local_20a8 [4];
  int exists;
  file_stat_t st;
  char path [8192];
  int skip_user_local;
  connection *conn_local;
  
  conn->endpoint_type = EP_NONE;
  if ((conn->server->event_handler != (mg_handler_t)0x0) &&
     (iVar1 = call_user(conn,MG_AUTH), iVar1 == 0)) {
    mg_send_digest_auth_request(&conn->mg_conn);
    return;
  }
  if ((skip_user == 0) && (conn->server->event_handler != (mg_handler_t)0x0)) {
    conn->endpoint_type = EP_USER;
    return;
  }
  iVar1 = strcmp((conn->mg_conn).request_method,"CONNECT");
  if ((iVar1 == 0) || (iVar1 = mg_strncasecmp((conn->mg_conn).uri,"http",4), iVar1 == 0)) {
    __s1 = conn->server->config_options[8];
    if ((__s1 != (char *)0x0) && (iVar1 = strcmp(__s1,"yes"), iVar1 == 0)) {
      proxify_connection(conn);
      return;
    }
    send_http_error(conn,0x195,(char *)0x0);
    return;
  }
  iVar1 = strcmp((conn->mg_conn).request_method,"OPTIONS");
  if (iVar1 == 0) {
    send_options(conn);
    return;
  }
  iVar1 = convert_uri_to_file_name
                    (conn,(char *)(st.__glibc_reserved + 2),0x2000,(file_stat_t *)local_20a8);
  iVar2 = strcmp((conn->mg_conn).request_method,"OPTIONS");
  if (iVar2 == 0) {
    send_options(conn);
    return;
  }
  if (conn->server->config_options[6] == (char *)0x0) {
    send_http_error(conn,0x194,(char *)0x0);
    return;
  }
  iVar2 = is_dav_request(conn);
  if (iVar2 == 0) {
    local_20b9 = iVar1 != 0 && ((uint)st.st_nlink & 0xf000) == 0x4000;
    iVar2 = is_authorized(conn,(char *)(st.__glibc_reserved + 2),(uint)local_20b9);
    if (iVar2 == 0) goto LAB_0010f40a;
  }
  iVar2 = is_dav_request(conn);
  if ((iVar2 == 0) || (iVar2 = is_authorized_for_dav(conn), iVar2 != 0)) {
    iVar2 = must_hide_file(conn,(char *)(st.__glibc_reserved + 2));
    if (iVar2 != 0) {
      send_http_error(conn,0x194,(char *)0x0);
      return;
    }
    iVar2 = strcmp((conn->mg_conn).request_method,"PROPFIND");
    if (iVar2 == 0) {
      handle_propfind(conn,(char *)(st.__glibc_reserved + 2),(file_stat_t *)local_20a8,iVar1);
      return;
    }
    iVar2 = strcmp((conn->mg_conn).request_method,"MKCOL");
    if (iVar2 == 0) {
      handle_mkcol(conn,(char *)(st.__glibc_reserved + 2));
      return;
    }
    iVar2 = strcmp((conn->mg_conn).request_method,"DELETE");
    if (iVar2 == 0) {
      handle_delete(conn,(char *)(st.__glibc_reserved + 2));
      return;
    }
    iVar2 = strcmp((conn->mg_conn).request_method,"PUT");
    if (iVar2 == 0) {
      handle_put(conn,(char *)(st.__glibc_reserved + 2));
      return;
    }
    mg_send_file_internal
              (&conn->mg_conn,(char *)(st.__glibc_reserved + 2),(file_stat_t *)local_20a8,iVar1,
               (char *)0x0);
    return;
  }
LAB_0010f40a:
  mg_send_digest_auth_request(&conn->mg_conn);
  close_local_endpoint(conn);
  return;
}

Assistant:

static void open_local_endpoint(struct connection *conn, int skip_user) {
#ifndef MONGOOSE_NO_FILESYSTEM
  char path[MAX_PATH_SIZE];
  file_stat_t st;
  int exists = 0;
#endif

  // If EP_USER was set in a prev call, reset it
  conn->endpoint_type = EP_NONE;

#ifndef MONGOOSE_NO_AUTH
  if (conn->server->event_handler && call_user(conn, MG_AUTH) == MG_FALSE) {
    mg_send_digest_auth_request(&conn->mg_conn);
    return;
  }
#endif

  // Call URI handler if one is registered for this URI
  if (skip_user == 0 && conn->server->event_handler != NULL) {
    conn->endpoint_type = EP_USER;
#if MONGOOSE_POST_SIZE_LIMIT > 1
    {
      const char *cl = mg_get_header(&conn->mg_conn, "Content-Length");
      if ((strcmp(conn->mg_conn.request_method, "POST") == 0 ||
           strcmp(conn->mg_conn.request_method, "PUT") == 0) &&
          (cl == NULL || to64(cl) > MONGOOSE_POST_SIZE_LIMIT)) {
        send_http_error(conn, 500, "POST size > %lu",
                        (unsigned long) MONGOOSE_POST_SIZE_LIMIT);
      }
    }
#endif
    return;
  }

  if (strcmp(conn->mg_conn.request_method, "CONNECT") == 0 ||
      mg_strncasecmp(conn->mg_conn.uri, "http", 4) == 0) {
    const char *enp = conn->server->config_options[ENABLE_PROXY];
    if (enp == NULL || strcmp(enp, "yes") != 0) {
      send_http_error(conn, 405, NULL);
    } else {
      proxify_connection(conn);
    }
    return;
  }

  if (!strcmp(conn->mg_conn.request_method, "OPTIONS")) {
    send_options(conn);
    return;
  }

#ifdef MONGOOSE_NO_FILESYSTEM
  send_http_error(conn, 404, NULL);
#else
  exists = convert_uri_to_file_name(conn, path, sizeof(path), &st);

  if (!strcmp(conn->mg_conn.request_method, "OPTIONS")) {
    send_options(conn);
  } else if (conn->server->config_options[DOCUMENT_ROOT] == NULL) {
    send_http_error(conn, 404, NULL);
#ifndef MONGOOSE_NO_AUTH
  } else if ((!is_dav_request(conn) && !is_authorized(conn, path,
               exists && S_ISDIR(st.st_mode))) ||
             (is_dav_request(conn) && !is_authorized_for_dav(conn))) {
    mg_send_digest_auth_request(&conn->mg_conn);
    close_local_endpoint(conn);
#endif
#ifndef MONGOOSE_NO_DAV
  } else if (must_hide_file(conn, path)) {
    send_http_error(conn, 404, NULL);
  } else if (!strcmp(conn->mg_conn.request_method, "PROPFIND")) {
    handle_propfind(conn, path, &st, exists);
  } else if (!strcmp(conn->mg_conn.request_method, "MKCOL")) {
    handle_mkcol(conn, path);
  } else if (!strcmp(conn->mg_conn.request_method, "DELETE")) {
    handle_delete(conn, path);
  } else if (!strcmp(conn->mg_conn.request_method, "PUT")) {
    handle_put(conn, path);
#endif
  } else {
    mg_send_file_internal(&conn->mg_conn, path, &st, exists, NULL);
  }
#endif  // MONGOOSE_NO_FILESYSTEM
}